

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aomdec.c
# Opt level: O1

FILE * open_outfile(char *name)

{
  int iVar1;
  FILE *pFVar2;
  
  iVar1 = strcmp("-",name);
  if (iVar1 == 0) {
    set_binary_mode((FILE *)_stdout);
    pFVar2 = _stdout;
  }
  else {
    pFVar2 = fopen64(name,"wb");
    if (pFVar2 == (FILE *)0x0) {
      fatal("Failed to open output file \'%s\'",name);
    }
  }
  return (FILE *)pFVar2;
}

Assistant:

static FILE *open_outfile(const char *name) {
  if (strcmp("-", name) == 0) {
    set_binary_mode(stdout);
    return stdout;
  } else {
    FILE *file = fopen(name, "wb");
    if (!file) fatal("Failed to open output file '%s'", name);
    return file;
  }
}